

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QStaticTextItem>::emplace<QStaticTextItem_const&>
          (QMovableArrayOps<QStaticTextItem> *this,qsizetype i,QStaticTextItem *args)

{
  QStaticTextItem **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_a0;
  QStaticTextItem tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QStaticTextItem>).super_QArrayDataPointer<QStaticTextItem>.
           d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QStaticTextItem>).super_QArrayDataPointer<QStaticTextItem>.
        size == i) {
      qVar5 = QArrayDataPointer<QStaticTextItem>::freeSpaceAtEnd
                        ((QArrayDataPointer<QStaticTextItem> *)this);
      if (qVar5 == 0) goto LAB_00447a55;
      QStaticTextItem::QStaticTextItem
                ((this->super_QGenericArrayOps<QStaticTextItem>).
                 super_QArrayDataPointer<QStaticTextItem>.ptr +
                 (this->super_QGenericArrayOps<QStaticTextItem>).
                 super_QArrayDataPointer<QStaticTextItem>.size,args);
LAB_00447b4f:
      pqVar2 = &(this->super_QGenericArrayOps<QStaticTextItem>).
                super_QArrayDataPointer<QStaticTextItem>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00447b08;
    }
LAB_00447a55:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QStaticTextItem>::freeSpaceAtBegin
                        ((QArrayDataPointer<QStaticTextItem> *)this);
      if (qVar5 != 0) {
        QStaticTextItem::QStaticTextItem
                  ((this->super_QGenericArrayOps<QStaticTextItem>).
                   super_QArrayDataPointer<QStaticTextItem>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QStaticTextItem>).
                   super_QArrayDataPointer<QStaticTextItem>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00447b4f;
      }
    }
  }
  tmp.m_fontEngine.d.ptr = (totally_ordered_wrapper<QFontEngine_*>)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_userData.d.ptr = (totally_ordered_wrapper<QStaticTextUserData_*>)&DAT_aaaaaaaaaaaaaaaa;
  tmp.color._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.font._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.color._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.font.d.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  tmp.field_0.glyphPositions = (QFixedPoint *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.field_1.glyphs = (glyph_t *)&DAT_aaaaaaaaaaaaaaaa;
  QStaticTextItem::QStaticTextItem(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QStaticTextItem>).super_QArrayDataPointer<QStaticTextItem>.
          size != 0;
  QArrayDataPointer<QStaticTextItem>::detachAndGrow
            ((QArrayDataPointer<QStaticTextItem> *)this,(uint)(i == 0 && bVar6),1,
             (QStaticTextItem **)0x0,(QArrayDataPointer<QStaticTextItem> *)0x0);
  if (i == 0 && bVar6) {
    QStaticTextItem::QStaticTextItem
              ((this->super_QGenericArrayOps<QStaticTextItem>).
               super_QArrayDataPointer<QStaticTextItem>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QStaticTextItem>).
               super_QArrayDataPointer<QStaticTextItem>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QStaticTextItem>).
              super_QArrayDataPointer<QStaticTextItem>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_a0,(QArrayDataPointer<QStaticTextItem> *)this,i,1);
    QStaticTextItem::QStaticTextItem(local_a0.displaceFrom,&tmp);
    local_a0.displaceFrom = local_a0.displaceFrom + 1;
    Inserter::~Inserter(&local_a0);
  }
  QStaticTextItem::~QStaticTextItem(&tmp);
LAB_00447b08:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }